

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O3

int Smt_PrsBuildNode(Wlc_Ntk_t *pNtk,Smt_Prs_t *p,int iNode,int RangeOut,char *pName)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  undefined4 extraout_var;
  char *pcVar5;
  undefined4 extraout_var_00;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Wlc_Obj_t *pWVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  char Buffer [100];
  int local_b0;
  int local_ac;
  undefined8 local_a8;
  char *local_a0;
  int local_98 [26];
  
  local_a0 = pName;
  if (iNode < 0) {
LAB_0036f370:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x130,"int Abc_LitIsCompl(int)");
  }
  if ((iNode & 1U) == 0) {
    do {
      uVar10 = (uint)iNode >> 1;
      if ((p->vObjs).nSize <= (int)uVar10) goto LAB_0036f3ae;
      pVVar1 = (p->vObjs).pArray;
      iVar2 = pVVar1[uVar10].nSize;
      if (iVar2 < 1) goto LAB_0036f38f;
      uVar13 = *pVVar1[uVar10].pArray;
      if ((int)uVar13 < 0) goto LAB_0036f370;
      if ((uVar13 & 1) == 0) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = Abc_NamStr(p->pStrs,uVar13 >> 1);
        iVar2 = pVVar1[uVar10].nSize;
      }
      if (iVar2 < 2) goto LAB_0036f38f;
      uVar13 = pVVar1[uVar10].pArray[1];
      if ((int)uVar13 < 0) goto LAB_0036f370;
      if ((uVar13 & 1) == 0) {
        if (pcVar5 != (char *)0x0) goto LAB_0036edce;
LAB_0036eeb9:
        uVar13 = *pVVar1[uVar10].pArray;
        if ((int)uVar13 < 0) goto LAB_0036f370;
        if ((uVar13 & 1) == 0) {
          uVar13 = uVar13 >> 1;
          if ((p->vObjs).nSize <= (int)uVar13) {
LAB_0036f3ae:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                          ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          pVVar6 = (p->vObjs).pArray;
          iVar2 = pVVar6[uVar13].nSize;
          if (iVar2 < 1) goto LAB_0036f38f;
          uVar3 = *pVVar6[uVar13].pArray;
          if ((int)uVar3 < 0) goto LAB_0036f370;
          if ((uVar3 & 1) == 0) {
            pcVar5 = (char *)0x0;
          }
          else {
            pcVar5 = Abc_NamStr(p->pStrs,uVar3 >> 1);
            iVar2 = pVVar6[uVar13].nSize;
          }
          if (iVar2 < 3) {
            __assert_fail("Vec_IntSize(vFans) >= 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                          ,0xf8,"int Smt_PrsReadType(Smt_Prs_t *, int, int *, int *, int *)");
          }
          if ((*pcVar5 != '_') || (pcVar5[1] != '\0')) {
            __assert_fail("!strcmp(pStr, \"_\")",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                          ,0xf9,"int Smt_PrsReadType(Smt_Prs_t *, int, int *, int *, int *)");
          }
          uVar3 = pVVar6[uVar13].pArray[1];
          if ((int)uVar3 < 0) goto LAB_0036f370;
          pcVar5 = (char *)0x0;
          if ((uVar3 & 1) != 0) {
            pcVar5 = Abc_NamStr(p->pStrs,uVar3 >> 1);
          }
          iVar2 = Smt_StrToType(pcVar5,&local_ac);
          local_a8 = CONCAT44(extraout_var_00,iVar2);
          local_b0 = -1;
          if (iVar2 == 0) {
            uVar3 = 0xffffffff;
            local_a8 = 0;
          }
          else {
            iVar2 = pVVar6[uVar13].nSize;
            if (iVar2 < 3) goto LAB_0036f38f;
            uVar3 = pVVar6[uVar13].pArray[2];
            if ((int)uVar3 < 0) goto LAB_0036f370;
            if ((uVar3 & 1) == 0) {
              pcVar5 = (char *)0x0;
            }
            else {
              pcVar5 = Abc_NamStr(p->pStrs,uVar3 >> 1);
              iVar2 = pVVar6[uVar13].nSize;
            }
            uVar3 = atoi(pcVar5);
            if (3 < iVar2) {
              uVar13 = pVVar6[uVar13].pArray[3];
              if ((int)uVar13 < 0) goto LAB_0036f370;
              if ((uVar13 & 1) == 0) {
                pcVar5 = (char *)0x0;
              }
              else {
                pcVar5 = Abc_NamStr(p->pStrs,uVar13 >> 1);
              }
              local_b0 = atoi(pcVar5);
            }
          }
        }
        else {
          pcVar5 = Abc_NamStr(p->pStrs,uVar13 >> 1);
          iVar2 = Smt_StrToType(pcVar5,&local_ac);
          local_a8 = CONCAT44(extraout_var,iVar2);
          uVar3 = 0xffffffff;
          local_b0 = -1;
        }
        pVVar6 = (Vec_Int_t *)malloc(0x10);
        pVVar6->nCap = 100;
        pVVar6->nSize = 0;
        piVar7 = (int *)malloc(400);
        pVVar6->pArray = piVar7;
        if (1 < pVVar1[uVar10].nSize) {
          lVar12 = 1;
          do {
            iVar2 = Smt_PrsBuildNode(pNtk,p,pVVar1[uVar10].pArray[lVar12],-1,(char *)0x0);
            if (iVar2 == 0) {
              if (pVVar6->pArray != (int *)0x0) {
                free(pVVar6->pArray);
              }
              free(pVVar6);
              return 0;
            }
            Vec_IntPush(pVVar6,iVar2);
            lVar12 = lVar12 + 1;
          } while (lVar12 < pVVar1[uVar10].nSize);
        }
        iVar2 = (int)local_a8;
        uVar10 = iVar2 - 0x1a;
        if (0xfffffffd < uVar10) {
          __assert_fail("Type != WLC_OBJ_BIT_SIGNEXT && Type != WLC_OBJ_BIT_ZEROPAD",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                        ,0x2e5,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
        }
        if (iVar2 == 0x16) {
          if ((((int)uVar3 < 0) || (local_b0 < 0)) || ((int)uVar3 < local_b0)) {
            __assert_fail("Value1 >= 0 && Value2 >= 0 && Value1 >= Value2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                          ,0x2e8,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)")
            ;
          }
          Vec_IntPush(pVVar6,uVar3);
          Vec_IntPush(pVVar6,local_b0);
          iVar15 = (uVar3 - local_b0) + 1;
LAB_0036f190:
          if (iVar15 < 1) {
LAB_0036f199:
            __assert_fail("Range > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                          ,0x30c,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)")
            ;
          }
        }
        else {
          if (iVar2 - 0xdU < 2) {
            if ((int)uVar3 < 0) {
              __assert_fail("Value1 >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                            ,0x2ee,
                            "int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
            }
            sprintf((char *)local_98,"%d",(ulong)uVar3);
            iVar2 = Smt_PrsBuildConstant(pNtk,(char *)local_98,-1,(char *)0x0);
            Vec_IntPush(pVVar6,iVar2);
            iVar2 = (int)local_a8;
          }
          iVar15 = 1;
          if (0xd < uVar10) {
            uVar10 = pVVar6->nSize;
            if (iVar2 == 8) {
              if (uVar10 != 3) {
                __assert_fail("Vec_IntSize(vFanins) == 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                              ,0x301,
                              "int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
              }
              piVar7 = pVVar6->pArray;
              iVar15 = piVar7[1];
              iVar9 = piVar7[2];
              piVar7[1] = iVar9;
              piVar7[2] = iVar15;
            }
            else {
              if (iVar2 == 0x17) {
                if ((int)uVar10 < 1) goto LAB_0036f199;
                uVar11 = 0;
                iVar15 = 0;
                do {
                  lVar12 = (long)pVVar6->pArray[uVar11];
                  if ((lVar12 < 1) || (pNtk->nObjsAlloc <= pVVar6->pArray[uVar11])) {
                    __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                                  ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
                  }
                  iVar14 = pNtk->pObjs[lVar12].End - pNtk->pObjs[lVar12].Beg;
                  iVar9 = -iVar14;
                  if (0 < iVar14) {
                    iVar9 = iVar14;
                  }
                  iVar15 = iVar15 + iVar9 + 1;
                  uVar11 = uVar11 + 1;
                } while (uVar10 != uVar11);
                goto LAB_0036f190;
              }
              if ((int)uVar10 < 1) {
LAB_0036f38f:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              iVar9 = *pVVar6->pArray;
            }
            pWVar8 = Wlc_NtkObj(pNtk,iVar9);
            iVar9 = pWVar8->End - pWVar8->Beg;
            iVar15 = -iVar9;
            if (0 < iVar9) {
              iVar15 = iVar9;
            }
            iVar15 = iVar15 + 1;
          }
        }
        iVar2 = Smt_PrsCreateNode(pNtk,iVar2,local_ac,iVar15,pVVar6,local_a0);
        if (pVVar6->pArray != (int *)0x0) {
          free(pVVar6->pArray);
        }
LAB_0036f30a:
        free(pVVar6);
        return iVar2;
      }
      pcVar4 = Abc_NamStr(p->pStrs,uVar13 >> 1);
      if ((pcVar5 == (char *)0x0) || (pcVar4 == (char *)0x0)) {
        iVar2 = pVVar1[uVar10].nSize;
        if (pcVar5 != (char *)0x0) goto LAB_0036edce;
LAB_0036eeb1:
        if (0 < iVar2) goto LAB_0036eeb9;
        goto LAB_0036f38f;
      }
      if (((*pcVar5 == '_') && (*pcVar4 == 'b')) && (pcVar4[1] == 'v')) {
        iVar2 = pVVar1[uVar10].nSize;
        if (iVar2 < 3) goto LAB_0036f38f;
        uVar13 = pVVar1[uVar10].pArray[2];
        if ((int)uVar13 < 0) goto LAB_0036f370;
        if ((uVar13 & 1) == 0) {
          pcVar5 = (char *)0x0;
        }
        else {
          pcVar5 = Abc_NamStr(p->pStrs,uVar13 >> 1);
          iVar2 = pVVar1[uVar10].nSize;
        }
        if (iVar2 != 3) {
          __assert_fail("Vec_IntSize(vFans) == 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                        ,0x2b6,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
        }
        pcVar4 = pcVar4 + 2;
        RangeOut = atoi(pcVar5);
        goto LAB_0036ee6f;
      }
      iVar2 = pVVar1[uVar10].nSize;
LAB_0036edce:
      if (*pcVar5 != '=') goto LAB_0036eeb1;
      if (iVar2 != 3) {
        __assert_fail("Vec_IntSize(vFans) == 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                      ,699,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
      }
      uVar13 = pVVar1[uVar10].pArray[2];
      if ((int)uVar13 < 0) goto LAB_0036f370;
      if ((uVar13 & 1) == 0) {
        __assert_fail("Smt_EntryIsName(iNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                      ,0x2bd,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
      }
      pcVar5 = Abc_NamStr(p->pStrs,uVar13 >> 1);
      iVar2 = strcmp("#b1",pcVar5);
      if (iVar2 != 0) {
        pVVar6 = (Vec_Int_t *)malloc(0x10);
        pVVar6->nCap = 0x10;
        pVVar6->nSize = 0;
        piVar7 = (int *)malloc(0x40);
        pVVar6->pArray = piVar7;
        iVar2 = Smt_PrsBuildConstant(pNtk,pcVar5,-1,(char *)0x0);
        pcVar5 = local_a0;
        if (pVVar1[uVar10].nSize < 2) goto LAB_0036f38f;
        iVar15 = Smt_PrsBuildNode(pNtk,p,pVVar1[uVar10].pArray[1],-1,local_a0);
        Vec_IntPush(pVVar6,iVar15);
        Vec_IntPush(pVVar6,iVar2);
        iVar2 = Smt_PrsCreateNode(pNtk,0x1f,0,1,pVVar6,pcVar5);
        if (pVVar6->pArray != (int *)0x0) {
          free(pVVar6->pArray);
        }
        goto LAB_0036f30a;
      }
      if (pVVar1[uVar10].nSize < 2) goto LAB_0036f38f;
      iNode = pVVar1[uVar10].pArray[1];
      if (iNode < 0) goto LAB_0036f370;
    } while ((iNode & 1U) == 0);
    RangeOut = -1;
  }
  pcVar4 = Abc_NamStr(p->pStrs,(uint)iNode >> 1);
  if (*pcVar4 != '#' && 9 < (byte)(*pcVar4 - 0x30U)) {
    iVar2 = Abc_NamStrFindOrAdd(pNtk->pManName,pcVar4,local_98);
    if (local_98[0] != 0) {
      return iVar2;
    }
    __assert_fail("fFound",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadSmt.c"
                  ,0x2a9,"int Smt_PrsBuildNode(Wlc_Ntk_t *, Smt_Prs_t *, int, int, char *)");
  }
LAB_0036ee6f:
  iVar2 = Smt_PrsBuildConstant(pNtk,pcVar4,RangeOut,local_a0);
  return iVar2;
}

Assistant:

int Smt_PrsBuildNode( Wlc_Ntk_t * pNtk, Smt_Prs_t * p, int iNode, int RangeOut, char * pName )
{
    if ( Smt_EntryIsName(iNode) ) // name or constant
    {
        char * pStr = Abc_NamStr(p->pStrs, Abc_Lit2Var(iNode));
        if ( (pStr[0] >= '0' && pStr[0] <= '9') || pStr[0] == '#' )
        { 
            // (_ BitVec 8) #x19
            return Smt_PrsBuildConstant( pNtk, pStr, RangeOut, pName );
        }
        else
        {
            // s3087
            int fFound, iObj = Abc_NamStrFindOrAdd( pNtk->pManName, pStr, &fFound );
            assert( fFound );
            return iObj;
        }
    }
    else // node
    {
        Vec_Int_t * vFans = Smt_EntryNode( p, iNode );
        char * pStr0 = Smt_VecEntryName( p, vFans, 0 );
        char * pStr1 = Smt_VecEntryName( p, vFans, 1 );
        if ( pStr0 && pStr1 && pStr0[0] == '_' && pStr1[0] == 'b' && pStr1[1] == 'v' )
        {
            // (_ bv1 32)
            char * pStr2 = Smt_VecEntryName( p, vFans, 2 );
            assert( Vec_IntSize(vFans) == 3 );
            return Smt_PrsBuildConstant( pNtk, pStr1+2, atoi(pStr2), pName );
        }
        else if ( pStr0 && pStr0[0] == '=' )
        {
            assert( Vec_IntSize(vFans) == 3 );
            iNode = Vec_IntEntry(vFans, 2);
            assert( Smt_EntryIsName(iNode) );
            pStr0 = Smt_EntryName(p, iNode);
            // check the last one is "#b1"
            if ( !strcmp("#b1", pStr0) )
            {
                iNode = Vec_IntEntry(vFans, 1);
                return Smt_PrsBuildNode( pNtk, p, iNode, -1, pName );
            }
            else
            {
                Vec_Int_t * vFanins = Vec_IntAlloc( 2 );
                // get the constant
                int iObj, iOper, iConst = Smt_PrsBuildConstant( pNtk, pStr0, -1, NULL );
                // check the middle one is an operator
                iNode = Vec_IntEntry(vFans, 1);
                iOper = Smt_PrsBuildNode( pNtk, p, iNode, -1, pName );
                // build comparator
                Vec_IntPushTwo( vFanins, iOper, iConst );
                iObj = Smt_PrsCreateNode( pNtk, WLC_OBJ_COMP_EQU, 0, 1, vFanins, pName );
                Vec_IntFree( vFanins );
                return iObj;
            }
        }
        else
        {
            int i, Fan, NameId, iFanin, fSigned, Range, Value1 = -1, Value2 = -1;
            int Type = Smt_PrsReadType( p, Vec_IntEntry(vFans, 0), &fSigned, &Value1, &Value2 );
            // collect fanins
            Vec_Int_t * vFanins = Vec_IntAlloc( 100 );
            Vec_IntForEachEntryStart( vFans, Fan, i, 1 )
            {
                iFanin = Smt_PrsBuildNode( pNtk, p, Fan, -1, NULL );
                if ( iFanin == 0 )
                {
                    Vec_IntFree( vFanins );
                    return 0;
                }
                Vec_IntPush( vFanins, iFanin );
            }
            // update specialized nodes
            assert( Type != WLC_OBJ_BIT_SIGNEXT && Type != WLC_OBJ_BIT_ZEROPAD );
            if ( Type == WLC_OBJ_BIT_SELECT )
            {
                assert( Value1 >= 0 && Value2 >= 0 && Value1 >= Value2 );
                Vec_IntPushTwo( vFanins, Value1, Value2 );
            }
            else if ( Type == WLC_OBJ_ROTATE_R || Type == WLC_OBJ_ROTATE_L )
            {
                char Buffer[100];
                assert( Value1 >= 0 );
                sprintf( Buffer, "%d", Value1 ); 
                NameId = Smt_PrsBuildConstant( pNtk, Buffer, -1, NULL );
                Vec_IntPush( vFanins, NameId );
            }
            // find range
            Range = 0;
            if ( Type >= WLC_OBJ_LOGIC_NOT && Type <= WLC_OBJ_REDUCT_XOR )
                Range = 1;
            else if ( Type == WLC_OBJ_BIT_SELECT )
                Range = Value1 - Value2 + 1;
            else if ( Type == WLC_OBJ_BIT_CONCAT )
            {
                Vec_IntForEachEntry( vFanins, NameId, i )
                    Range += Wlc_ObjRange( Wlc_NtkObj(pNtk, NameId) );
            }
            else if ( Type == WLC_OBJ_MUX )
            {
                int * pArray = Vec_IntArray(vFanins);
                assert( Vec_IntSize(vFanins) == 3 );
                ABC_SWAP( int, pArray[1], pArray[2] );
                NameId = Vec_IntEntry(vFanins, 1);
                Range = Wlc_ObjRange( Wlc_NtkObj(pNtk, NameId) );
            }
            else // to determine range, look at the first argument
            {
                NameId = Vec_IntEntry(vFanins, 0);
                Range = Wlc_ObjRange( Wlc_NtkObj(pNtk, NameId) );
            }
            // create node
            assert( Range > 0 );
            NameId = Smt_PrsCreateNode( pNtk, Type, fSigned, Range, vFanins, pName );
            Vec_IntFree( vFanins );
            return NameId;
        }
    }
}